

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# claim_strategy.h
# Opt level: O0

int64_t __thiscall
disruptor::SingleThreadedStrategy::IncrementAndGet
          (SingleThreadedStrategy *this,Sequence *cursor,
          vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *dependents,
          size_t delta)

{
  long lVar1;
  int64_t iVar2;
  long in_RCX;
  long lVar3;
  long *in_RDI;
  vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *unaff_retaddr;
  int64_t wrap_point;
  int64_t next_sequence;
  
  lVar3 = in_RCX + in_RDI[1];
  in_RDI[1] = lVar3;
  lVar1 = *in_RDI;
  if (in_RDI[2] < lVar3 - lVar1) {
    while (iVar2 = GetMinimumSequence(unaff_retaddr,(int64_t)in_RDI), iVar2 < lVar3 - lVar1) {
      std::this_thread::yield();
    }
  }
  return lVar3;
}

Assistant:

int64_t IncrementAndGet(Sequence& cursor,
                          const std::vector<Sequence*>& dependents,
                          size_t delta = 1) {
    const int64_t next_sequence = (last_claimed_sequence_ += delta);
    const int64_t wrap_point = next_sequence - buffer_size_;
    if (last_consumer_sequence_ < wrap_point) {
      while (GetMinimumSequence(dependents) < wrap_point) {
        // TODO: configurable yield strategy
        std::this_thread::yield();
      }
    }
    return next_sequence;
  }